

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

int __thiscall phosg::Poll::poll(Poll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  pollfd pVar1;
  int iVar2;
  uint *puVar3;
  short *psVar4;
  pollfd pVar5;
  undefined1 auVar6 [12];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = ::poll((pollfd *)*__fds,(long)__fds[1] - (long)*__fds >> 3,(int)__nfds);
  if (iVar2 < 0) {
    puVar3 = (uint *)__errno_location();
    if (*puVar3 != 4) {
      auVar6 = __cxa_allocate_exception(0x10);
      string_for_error_abi_cxx11_(&local_60,(phosg *)(ulong)*puVar3,auVar6._8_4_);
      ::std::operator+(&local_40,"poll failed: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60);
      ::std::runtime_error::runtime_error(auVar6._0_8_,(string *)&local_40);
      __cxa_throw(auVar6._0_8_,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error)
      ;
    }
    this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(this + 2);
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined4 *)
     &this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
      super__Vector_impl_data._M_finish = 0x3f800000;
    this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[2].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(this + 2);
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined4 *)
     &this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
      super__Vector_impl_data._M_finish = 0x3f800000;
    this[1].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[2].poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pVar1 = __fds[1];
    if (*__fds != pVar1) {
      psVar4 = (short *)((long)*__fds + 6);
      do {
        if (*psVar4 != 0) {
          ::std::
          _Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<int_const&,short_const&>
                    ((_Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this,psVar4 + -3,psVar4);
        }
        pVar5 = (pollfd)(psVar4 + 1);
        psVar4 = psVar4 + 4;
      } while (pVar5 != pVar1);
    }
  }
  return (int)this;
}

Assistant:

unordered_map<int, short> Poll::poll(int timeout_ms) {
  if (::poll(this->poll_fds.data(), this->poll_fds.size(), timeout_ms) < 0) {
    if (errno == EINTR) {
      return unordered_map<int, short>();
    }
    throw runtime_error("poll failed: " + string_for_error(errno));
  }

  unordered_map<int, short> ret;
  for (const auto& pfd : this->poll_fds) {
    if (pfd.revents) {
      ret.emplace(pfd.fd, pfd.revents);
    }
  }
  return ret;
}